

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.h
# Opt level: O2

string * __thiscall
TextContent::Evaluate_abi_cxx11_
          (string *__return_storage_ptr__,TextContent *this,cmGeneratorExpressionContext *param_1,
          cmGeneratorExpressionDAGChecker *param_2)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = this->Content;
  sVar2 = this->Length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(cmGeneratorExpressionContext *,
                       cmGeneratorExpressionDAGChecker *) const
  {
    return std::string(this->Content, this->Length);
  }